

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O3

void __thiscall
gmath::PinholeCamera::reconstructPoint(PinholeCamera *this,Vector3d *Pw,Vector2d *p,double d)

{
  double dVar1;
  int i;
  long lVar2;
  Matrix33d *pMVar3;
  IOException *this_00;
  int k;
  long lVar4;
  Vector3d Pc;
  SVector<double,_3> ret;
  SVector<double,_3> ret_1;
  string local_88;
  double local_60;
  double local_58 [4];
  double local_38 [3];
  
  local_60 = d;
  if ((this->rho == 0.0) && (!NAN(this->rho))) {
    this_00 = (IOException *)__cxa_allocate_exception(0x28);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Cannot reconstruct point with unknown rho","");
    gutil::IOException::IOException(this_00,&local_88);
    __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  local_88.field_2._M_allocated_capacity = 0;
  reconstructLocal(this,(Vector3d *)&local_88,p);
  dVar1 = this->rho;
  lVar2 = 0;
  do {
    (&local_88._M_dataplus)[lVar2]._M_p =
         (pointer)((double)(&local_88._M_dataplus)[lVar2]._M_p * (dVar1 / local_60));
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  pMVar3 = &(this->super_Camera).R;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  lVar2 = 0;
  do {
    dVar1 = local_58[lVar2];
    lVar4 = 0;
    do {
      dVar1 = dVar1 + pMVar3->v[0][lVar4] * (double)(&local_88._M_dataplus)[lVar4]._M_p;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_58[lVar2] = dVar1;
    lVar2 = lVar2 + 1;
    pMVar3 = (Matrix33d *)(pMVar3->v + 1);
  } while (lVar2 != 3);
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  lVar2 = 0;
  do {
    local_38[lVar2] = local_58[lVar2] + (this->super_Camera).T.v[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  Pw->v[2] = local_38[2];
  Pw->v[0] = local_38[0];
  Pw->v[1] = local_38[1];
  return;
}

Assistant:

void PinholeCamera::reconstructPoint(Vector3d &Pw, const Vector2d &p, double d)
const
{
  if (rho == 0)
  {
    throw gutil::IOException("Cannot reconstruct point with unknown rho");
  }

  assert(std::isfinite(d));

  Vector3d Pc;
  reconstructLocal(Pc, p);

  Pc*=rho/d;

  Pw=getR()*Pc+getT();
}